

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fe241b::SatdTestBase<short,_int_(*)(const_short_*,_int)>::SetUp
          (SatdTestBase<short,_int_(*)(const_short_*,_int)> *this)

{
  bool bVar1;
  short **val1;
  void *pvVar2;
  AssertHelper *this_00;
  char *in_RDI;
  Message *in_stack_00000018;
  AssertHelper *in_stack_00000020;
  AssertionResult gtest_ar;
  int in_stack_ffffffffffffff9c;
  ACMRandom *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  Type in_stack_ffffffffffffffcc;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_18;
  
  val1 = (short **)(in_RDI + 0x38);
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::ACMRandom::Reset(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  pvVar2 = aom_memalign(CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),(size_t)in_RDI
                       );
  *(void **)(in_RDI + 0x20) = pvVar2;
  testing::internal::CmpHelperNE<short*,decltype(nullptr)>
            ((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI,val1,
             (void **)in_stack_ffffffffffffffa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xa51211)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc,in_RDI);
    testing::internal::AssertHelper::operator=(in_stack_00000020,in_stack_00000018);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xa5125f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa512bf);
  return;
}

Assistant:

void SetUp() override {
    rnd_.Reset(ACMRandom::DeterministicSeed());
    src_ = reinterpret_cast<CoeffType *>(
        aom_memalign(32, sizeof(*src_) * satd_size_));
    ASSERT_NE(src_, nullptr);
  }